

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_send(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t inlen)

{
  st_ptls_traffic_protection_t *enc;
  ptls_buffer_t *ppVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  byte bVar6;
  byte local_7a [2];
  ptls_buffer_t *local_78;
  size_t local_70;
  size_t local_68;
  st_ptls_record_message_emitter_t emitter;
  
  if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
    __assert_fail("tls->traffic_protection.enc.aead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0x12d7,"int ptls_send(ptls_t *, ptls_buffer_t *, const void *, size_t)");
  }
  bVar6 = tls->field_0x160;
  if (0xffffff < (tls->traffic_protection).enc.seq) {
    bVar6 = bVar6 | 8;
    tls->field_0x160 = bVar6;
  }
  enc = &(tls->traffic_protection).enc;
  if ((bVar6 & 8) == 0) {
LAB_0010cac0:
    iVar2 = buffer_push_encrypted_records(sendbuf,'\x17',(uint8_t *)input,inlen,enc);
  }
  else {
    emitter.super.record_header_length = 5;
    emitter.super.begin_message = begin_record_message;
    emitter.super.commit_message = commit_record_message;
    emitter.rec_start = 0;
    local_68 = sendbuf->off;
    emitter.super.buf = sendbuf;
    emitter.super.enc = enc;
    iVar2 = begin_record_message(&emitter.super);
    if (iVar2 == 0) {
      local_7a[1] = 0x18;
      local_78 = emitter.super.buf;
      iVar2 = ptls_buffer__do_pushv(emitter.super.buf,local_7a + 1,1);
      if (iVar2 == 0) {
        iVar2 = ptls_buffer__do_pushv(local_78,"",3);
        ppVar1 = local_78;
        if (iVar2 == 0) {
          sVar5 = local_78->off;
          local_7a[0] = bVar6 >> 4 & 1;
          local_70 = inlen;
          iVar2 = ptls_buffer__do_pushv(local_78,local_7a,1);
          if (iVar2 == 0) {
            uVar3 = ppVar1->off - sVar5;
            for (lVar4 = 0x10; lVar4 != -8; lVar4 = lVar4 + -8) {
              ppVar1->base[sVar5 - 3] = (uint8_t)(uVar3 >> ((byte)lVar4 & 0x3f));
              sVar5 = sVar5 + 1;
            }
            iVar2 = (*emitter.super.commit_message)(&emitter.super);
            if (iVar2 == 0) {
              iVar2 = update_traffic_key(tls,1);
              if (iVar2 == 0) {
                tls->field_0x160 = tls->field_0x160 & 0xe7;
                inlen = local_70;
                goto LAB_0010cac0;
              }
            }
          }
        }
      }
    }
    (emitter.super.buf)->off = local_68;
  }
  return iVar2;
}

Assistant:

int ptls_send(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t inlen)
{
    assert(tls->traffic_protection.enc.aead != NULL);

    /* "For AES-GCM, up to 2^24.5 full-size records (about 24 million) may be encrypted on a given connection while keeping a
     * safety margin of approximately 2^-57 for Authenticated Encryption (AE) security." (RFC 8446 section 5.5)
     */
    if (tls->traffic_protection.enc.seq >= 16777216)
        tls->needs_key_update = 1;

    if (tls->needs_key_update) {
        int ret;
        if ((ret = update_send_key(tls, sendbuf, tls->key_update_send_request)) != 0)
            return ret;
        tls->needs_key_update = 0;
        tls->key_update_send_request = 0;
    }

    return buffer_push_encrypted_records(sendbuf, PTLS_CONTENT_TYPE_APPDATA, input, inlen, &tls->traffic_protection.enc);
}